

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# have_sys_socket.c
# Opt level: O1

network_target * sys_socket_reopen_tcp6_target(network_target *target)

{
  int iVar1;
  
  lock_network_target(target);
  if (target->handle != -1) {
    close(target->handle);
    iVar1 = getaddrinfo_int_connect(target->destination,target->port,10,1,0);
    target->handle = iVar1;
  }
  unlock_network_target(target);
  return target;
}

Assistant:

struct network_target *
sys_socket_reopen_tcp6_target( struct network_target *target ) {
  lock_network_target( target );

  if( sys_socket_network_target_is_open( target ) ) {
    close( target->handle );
    target->handle = config_int_connect( target->destination,
                                         target->port,
                                         AF_INET6,
                                         SOCK_STREAM,
                                         0 );
  }

  unlock_network_target( target );
  return target;
}